

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalAllRules
          (cmLocalUnixMakefileGenerator3 *this,ostream *ruleFileStream)

{
  cmOutputConverter *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmGeneratorTarget *this_01;
  pointer pcVar2;
  cmGlobalGenerator *this_02;
  cmMakefile *this_03;
  cmake *this_04;
  pointer pbVar3;
  pointer pbVar4;
  _Alloc_hider _Var5;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  TargetType TVar10;
  string *psVar11;
  char *pcVar12;
  set<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *psVar13;
  _Rb_tree_node_base *p_Var14;
  size_t sVar15;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar16;
  string *psVar17;
  pointer pbVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  long *plVar20;
  long *plVar21;
  pointer ppcVar22;
  string recursiveTarget;
  string progressFileNameFull;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string mf2Dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string local_218;
  string progressDir;
  string targetString;
  ios_base local_160 [264];
  pointer local_58;
  string local_50;
  
  WriteDisclaimer(this,ruleFileStream);
  recursiveTarget.field_2._M_allocated_capacity = 0;
  recursiveTarget._M_dataplus._M_p = (pointer)0x0;
  recursiveTarget._M_string_length = 0;
  progressDir.field_2._M_allocated_capacity = 0;
  progressDir._M_dataplus._M_p = (pointer)0x0;
  progressDir._M_string_length = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[4]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&recursiveTarget,
             (char (*) [4])0x55848f);
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,"default_target","");
  WriteMakeRule(this,ruleFileStream,"Default target executed when no arguments are given to make.",
                &targetString,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&recursiveTarget,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&progressDir,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  iVar9 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x34])();
  if ((char)iVar9 != '\0') {
    mf2Dir._M_dataplus._M_p = (pointer)0x0;
    mf2Dir._M_string_length = 0;
    mf2Dir.field_2._M_allocated_capacity = 0;
    targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,".NOTPARALLEL","");
    WriteMakeRule(this,ruleFileStream,
                  "Allow only one \"make -f Makefile2\" at a time, but pass parallelism.",
                  &targetString,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&progressDir,false,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetString._M_dataplus._M_p != &targetString.field_2) {
      operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mf2Dir);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&progressDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&recursiveTarget);
  WriteSpecialTargetsTop(this,ruleFileStream);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"#======================================",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"=======================================\n",0x28);
  std::__ostream_insert<char,std::char_traits<char>>
            (ruleFileStream,"# Targets provided globally by CMake.\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>(ruleFileStream,"\n",1);
  ppcVar22 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_58 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets.
             super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (ppcVar22 != local_58) {
    do {
      this_01 = *ppcVar22;
      TVar10 = cmGeneratorTarget::GetType(this_01);
      if (TVar10 == GLOBAL_TARGET) {
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
        std::operator+(&targetString,"Special rule for the target ",psVar11);
        progressDir.field_2._M_allocated_capacity = 0;
        progressDir._M_dataplus._M_p = (pointer)0x0;
        progressDir._M_string_length = 0;
        mf2Dir.field_2._M_allocated_capacity = 0;
        mf2Dir._M_dataplus._M_p = (pointer)0x0;
        mf2Dir._M_string_length = 0;
        recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&recursiveTarget,"EchoString","");
        pcVar12 = cmGeneratorTarget::GetProperty(this_01,&recursiveTarget);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        if (pcVar12 == (char *)0x0) {
          pcVar12 = "Running external command ...";
        }
        psVar13 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this_01);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir,(psVar13->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
        psVar13 = cmGeneratorTarget::GetUtilities_abi_cxx11_(this_01);
        for (p_Var14 = (psVar13->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var14 != &(psVar13->_M_t)._M_impl.super__Rb_tree_header;
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,(value_type *)(p_Var14 + 1));
        }
        recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
        sVar15 = strlen(pcVar12);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&recursiveTarget,pcVar12,pcVar12 + sVar15);
        AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&progressDir,&recursiveTarget,EchoGlobal,(EchoProgress *)0x0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        pvVar16 = cmGeneratorTarget::GetPreBuildCommands(this_01);
        AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&mf2Dir,pvVar16);
        pvVar16 = cmGeneratorTarget::GetPostBuildCommands(this_01);
        AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&mf2Dir,pvVar16);
        pvVar16 = cmGeneratorTarget::GetPreBuildCommands(this_01);
        psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
        AppendCustomCommands
                  (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&progressDir,pvVar16,this_01,psVar11);
        pvVar16 = cmGeneratorTarget::GetPostBuildCommands(this_01);
        psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
        AppendCustomCommands
                  (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&progressDir,pvVar16,this_01,psVar11);
        psVar11 = cmGeneratorTarget::GetName_abi_cxx11_(this_01);
        recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
        pcVar2 = (psVar11->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&recursiveTarget,pcVar2,pcVar2 + psVar11->_M_string_length);
        WriteMakeRule(this,ruleFileStream,targetString._M_dataplus._M_p,&recursiveTarget,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&progressDir,true,false);
        sVar6 = mf2Dir._M_string_length;
        _Var5 = mf2Dir._M_dataplus;
        if ((pointer)mf2Dir._M_string_length != mf2Dir._M_dataplus._M_p) {
          plVar21 = (long *)(mf2Dir._M_dataplus._M_p + 0x10);
          do {
            if (plVar21 != (long *)plVar21[-2]) {
              operator_delete((long *)plVar21[-2],*plVar21 + 1);
            }
            plVar20 = plVar21 + 2;
            plVar21 = plVar21 + 4;
          } while (plVar20 != (long *)sVar6);
          mf2Dir._M_string_length = (size_type)_Var5._M_p;
        }
        iVar9 = std::__cxx11::string::compare((char *)&recursiveTarget);
        if (((iVar9 == 0) ||
            (iVar9 = std::__cxx11::string::compare((char *)&recursiveTarget), iVar9 == 0)) ||
           (iVar9 = std::__cxx11::string::compare((char *)&recursiveTarget), iVar9 == 0)) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const(&)[16]>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&mf2Dir,
                     (char (*) [16])"preinstall/fast");
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,&recursiveTarget);
          sVar6 = progressDir._M_string_length;
          _Var5 = progressDir._M_dataplus;
          if ((pointer)progressDir._M_string_length != progressDir._M_dataplus._M_p) {
            plVar21 = (long *)(progressDir._M_dataplus._M_p + 0x10);
            do {
              if (plVar21 != (long *)plVar21[-2]) {
                operator_delete((long *)plVar21[-2],*plVar21 + 1);
              }
              plVar20 = plVar21 + 2;
              plVar21 = plVar21 + 4;
            } while (plVar20 != (long *)sVar6);
            progressDir._M_string_length = (size_type)_Var5._M_p;
          }
        }
        std::__cxx11::string::append((char *)&recursiveTarget);
        WriteMakeRule(this,ruleFileStream,targetString._M_dataplus._M_p,&recursiveTarget,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&progressDir,true,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
          operator_delete(recursiveTarget._M_dataplus._M_p,
                          recursiveTarget.field_2._M_allocated_capacity + 1);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&progressDir);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetString._M_dataplus._M_p != &targetString.field_2) {
          operator_delete(targetString._M_dataplus._M_p,
                          targetString.field_2._M_allocated_capacity + 1);
        }
      }
      ppcVar22 = ppcVar22 + 1;
    } while (ppcVar22 != local_58);
  }
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar11 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  recursiveTarget._M_dataplus._M_p = (pointer)&recursiveTarget.field_2;
  pcVar2 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&recursiveTarget,pcVar2,pcVar2 + psVar11->_M_string_length);
  std::__cxx11::string::append((char *)&recursiveTarget);
  this_02 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&targetString,"CMAKE_SUPPRESS_REGENERATION","");
  bVar7 = cmGlobalGenerator::GlobalSettingIsOn(this_02,&targetString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  progressDir._M_dataplus._M_p = (pointer)&progressDir.field_2;
  pcVar2 = (psVar11->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&progressDir,pcVar2,pcVar2 + psVar11->_M_string_length);
  std::__cxx11::string::append((char *)&progressDir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&targetString);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&targetString,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
  cmsys::SystemTools::CollapseFullPath(&progressFileNameFull,&progressDir);
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::ConvertToOutputFormat(&mf2Dir,this_00,&progressFileNameFull,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&targetString,mf2Dir._M_dataplus._M_p,mf2Dir._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &progressFileNameFull.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)progressFileNameFull._M_dataplus._M_p != paVar1) {
    operator_delete(progressFileNameFull._M_dataplus._M_p,
                    progressFileNameFull.field_2._M_allocated_capacity + 1);
  }
  mf2Dir._M_dataplus._M_p = (pointer)&mf2Dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf2Dir,"/CMakeFiles","");
  std::__cxx11::string::append((char *)&mf2Dir);
  ConvertToFullPath(&progressFileNameFull,this,&mf2Dir);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&targetString," ",1);
  cmsys::SystemTools::CollapseFullPath(&local_50,&progressFileNameFull);
  cmOutputConverter::ConvertToOutputFormat(&local_218,this_00,&local_50,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&targetString,local_218._M_dataplus._M_p,local_218._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)progressFileNameFull._M_dataplus._M_p != paVar1) {
    operator_delete(progressFileNameFull._M_dataplus._M_p,
                    progressFileNameFull.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targetString);
  std::ios_base::~ios_base(local_160);
  mf2Dir._M_dataplus._M_p = (pointer)&mf2Dir.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&mf2Dir,"CMakeFiles/","");
  std::__cxx11::string::append((char *)&mf2Dir);
  GetRecursiveMakeCall(&targetString,this,&mf2Dir,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &targetString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  psVar17 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,psVar11,psVar17);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&targetString);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&targetString,"$(CMAKE_COMMAND) -E cmake_progress_start ",0x29);
  cmsys::SystemTools::CollapseFullPath(&local_218,&progressDir);
  cmOutputConverter::ConvertToOutputFormat(&progressFileNameFull,this_00,&local_218,SHELL);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&targetString,progressFileNameFull._M_dataplus._M_p,
             progressFileNameFull._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)progressFileNameFull._M_dataplus._M_p != paVar1) {
    operator_delete(progressFileNameFull._M_dataplus._M_p,
                    progressFileNameFull.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&targetString," 0",2);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &progressFileNameFull);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)progressFileNameFull._M_dataplus._M_p != paVar1) {
    operator_delete(progressFileNameFull._M_dataplus._M_p,
                    progressFileNameFull.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&targetString);
  std::ios_base::~ios_base(local_160);
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,"all","");
  WriteMakeRule(this,ruleFileStream,"The main all target",&targetString,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::_M_assign((string *)&recursiveTarget);
  std::__cxx11::string::append((char *)&recursiveTarget);
  pbVar4 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar19 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar21) {
        operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar18 != pbVar4);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  pbVar4 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar19 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar21) {
        operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar18 != pbVar4);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  GetRecursiveMakeCall(&targetString,this,&mf2Dir,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &targetString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  psVar17 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,psVar11,psVar17);
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,"clean","");
  WriteMakeRule(this,ruleFileStream,"The main clean target",&targetString,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  pbVar4 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar19 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar21) {
        operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar18 != pbVar4);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  pbVar4 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar19 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar21) {
        operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar18 != pbVar4);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[6]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             (char (*) [6])0x563784);
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,"clean/fast","");
  WriteMakeRule(this,ruleFileStream,"The main clean target",&targetString,&depends,&commands,true,
                false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::_M_assign((string *)&recursiveTarget);
  std::__cxx11::string::append((char *)&recursiveTarget);
  pbVar4 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = commands.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar19 = &(commands.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar21) {
        operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar18 != pbVar4);
    commands.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  pbVar4 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar19 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar21) {
        operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar18 != pbVar4);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  this_03 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&targetString,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY","");
  pcVar12 = cmMakefile::GetDefinition(this_03,&targetString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  if ((pcVar12 == (char *)0x0) || (bVar8 = cmSystemTools::IsOff(pcVar12), bVar8)) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[4]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [4])0x55848f);
  }
  else if (!bVar7) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[25]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
               (char (*) [25])"cmake_check_build_system");
  }
  GetRecursiveMakeCall(&targetString,this,&mf2Dir,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &targetString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  psVar17 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,psVar11,psVar17);
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,"preinstall","");
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&targetString,&depends,
                &commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  pbVar4 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar19 = &(depends.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar21) {
        operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
      }
      pbVar18 = (pointer)(paVar19 + 1);
      paVar19 = paVar19 + 2;
    } while (pbVar18 != pbVar4);
    depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
  }
  targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,"preinstall/fast","");
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&targetString,&depends,
                &commands,true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)targetString._M_dataplus._M_p != &targetString.field_2) {
    operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
  }
  pbVar4 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar3 = depends.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar7) {
    if (depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar19 = &(depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (paVar19 + -1))->_M_dataplus)._M_p;
        if (paVar19 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar21) {
          operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
        }
        pbVar18 = (pointer)(paVar19 + 1);
        paVar19 = paVar19 + 2;
      } while (pbVar18 != pbVar4);
      depends.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
    pbVar4 = commands.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = commands.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        commands.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar19 = &(commands.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar21 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (paVar19 + -1))->_M_dataplus)._M_p;
        if (paVar19 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar21) {
          operator_delete(plVar21,paVar19->_M_allocated_capacity + 1);
        }
        pbVar18 = (pointer)(paVar19 + 1);
        paVar19 = paVar19 + 2;
      } while (pbVar18 != pbVar4);
      commands.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
    this_04 = ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              CMakeInstance;
    bVar7 = cmake::DoWriteGlobVerifyTarget(this_04);
    if (bVar7) {
      targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetString,"$(CMAKE_COMMAND) -P ","");
      psVar11 = cmake::GetGlobVerifyScript_abi_cxx11_(this_04);
      cmOutputConverter::ConvertToOutputFormat(&progressFileNameFull,this_00,psVar11,SHELL);
      std::__cxx11::string::_M_append
                ((char *)&targetString,(ulong)progressFileNameFull._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)progressFileNameFull._M_dataplus._M_p != paVar1) {
        operator_delete(progressFileNameFull._M_dataplus._M_p,
                        progressFileNameFull.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&commands,&targetString);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetString._M_dataplus._M_p != &targetString.field_2) {
        operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1
                       );
      }
    }
    targetString._M_dataplus._M_p = (pointer)&targetString.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&targetString,"CMakeFiles/","");
    std::__cxx11::string::append((char *)&targetString);
    progressFileNameFull._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&progressFileNameFull,
               "$(CMAKE_COMMAND) -S$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)","");
    std::__cxx11::string::append((char *)&progressFileNameFull);
    cmOutputConverter::ConvertToOutputFormat(&local_218,this_00,&targetString,SHELL);
    std::__cxx11::string::_M_append((char *)&progressFileNameFull,(ulong)local_218._M_dataplus._M_p)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&progressFileNameFull);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
               &progressFileNameFull);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progressFileNameFull._M_dataplus._M_p != paVar1) {
      operator_delete(progressFileNameFull._M_dataplus._M_p,
                      progressFileNameFull.field_2._M_allocated_capacity + 1);
    }
    psVar11 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    psVar17 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    CreateCDCommand(this,&commands,psVar11,psVar17);
    progressFileNameFull._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&progressFileNameFull,"depend","");
    WriteMakeRule(this,ruleFileStream,"clear depends",&progressFileNameFull,&depends,&commands,true,
                  false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)progressFileNameFull._M_dataplus._M_p != paVar1) {
      operator_delete(progressFileNameFull._M_dataplus._M_p,
                      progressFileNameFull.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)targetString._M_dataplus._M_p != &targetString.field_2) {
      operator_delete(targetString._M_dataplus._M_p,targetString.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mf2Dir._M_dataplus._M_p != &mf2Dir.field_2) {
    operator_delete(mf2Dir._M_dataplus._M_p,mf2Dir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)progressDir._M_dataplus._M_p != &progressDir.field_2) {
    operator_delete(progressDir._M_dataplus._M_p,progressDir.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)recursiveTarget._M_dataplus._M_p != &recursiveTarget.field_2) {
    operator_delete(recursiveTarget._M_dataplus._M_p,
                    recursiveTarget.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::WriteLocalAllRules(
  std::ostream& ruleFileStream)
{
  this->WriteDisclaimer(ruleFileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  {
    // Just depend on the all target to drive the build.
    std::vector<std::string> depends;
    std::vector<std::string> no_commands;
    depends.emplace_back("all");

    // Write the rule.
    this->WriteMakeRule(ruleFileStream,
                        "Default target executed when no arguments are "
                        "given to make.",
                        "default_target", depends, no_commands, true);

    // Help out users that try "gmake target1 target2 -j".
    cmGlobalUnixMakefileGenerator3* gg =
      static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
    if (gg->AllowNotParallel()) {
      std::vector<std::string> no_depends;
      this->WriteMakeRule(ruleFileStream,
                          "Allow only one \"make -f "
                          "Makefile2\" at a time, but pass "
                          "parallelism.",
                          ".NOTPARALLEL", no_depends, no_commands, false);
    }
  }

  this->WriteSpecialTargetsTop(ruleFileStream);

  // Include the progress variables for the target.
  // Write all global targets
  this->WriteDivider(ruleFileStream);
  ruleFileStream << "# Targets provided globally by CMake.\n"
                 << "\n";
  const std::vector<cmGeneratorTarget*>& targets = this->GetGeneratorTargets();
  for (cmGeneratorTarget* gt : targets) {
    if (gt->GetType() == cmStateEnums::GLOBAL_TARGET) {
      std::string targetString =
        "Special rule for the target " + gt->GetName();
      std::vector<std::string> commands;
      std::vector<std::string> depends;

      const char* text = gt->GetProperty("EchoString");
      if (!text) {
        text = "Running external command ...";
      }
      depends.reserve(gt->GetUtilities().size());
      for (BT<std::string> const& u : gt->GetUtilities()) {
        depends.push_back(u.Value);
      }
      this->AppendEcho(commands, text,
                       cmLocalUnixMakefileGenerator3::EchoGlobal);

      // Global targets store their rules in pre- and post-build commands.
      this->AppendCustomDepends(depends, gt->GetPreBuildCommands());
      this->AppendCustomDepends(depends, gt->GetPostBuildCommands());
      this->AppendCustomCommands(commands, gt->GetPreBuildCommands(), gt,
                                 this->GetCurrentBinaryDirectory());
      this->AppendCustomCommands(commands, gt->GetPostBuildCommands(), gt,
                                 this->GetCurrentBinaryDirectory());
      std::string targetName = gt->GetName();
      this->WriteMakeRule(ruleFileStream, targetString.c_str(), targetName,
                          depends, commands, true);

      // Provide a "/fast" version of the target.
      depends.clear();
      if ((targetName == "install") || (targetName == "install/local") ||
          (targetName == "install/strip")) {
        // Provide a fast install target that does not depend on all
        // but has the same command.
        depends.emplace_back("preinstall/fast");
      } else {
        // Just forward to the real target so at least it will work.
        depends.push_back(targetName);
        commands.clear();
      }
      targetName += "/fast";
      this->WriteMakeRule(ruleFileStream, targetString.c_str(), targetName,
                          depends, commands, true);
    }
  }

  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Write the all rule.
  std::string recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/all";

  bool regenerate =
    !this->GlobalGenerator->GlobalSettingIsOn("CMAKE_SUPPRESS_REGENERATION");
  if (regenerate) {
    depends.emplace_back("cmake_check_build_system");
  }

  std::string progressDir = this->GetBinaryDirectory();
  progressDir += "/CMakeFiles";
  {
    std::ostringstream progCmd;
    progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start ";
    progCmd << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(progressDir), cmOutputConverter::SHELL);

    std::string progressFile = "/CMakeFiles";
    progressFile += "/progress.marks";
    std::string progressFileNameFull = this->ConvertToFullPath(progressFile);
    progCmd << " "
            << this->ConvertToOutputFormat(
                 cmSystemTools::CollapseFullPath(progressFileNameFull),
                 cmOutputConverter::SHELL);
    commands.push_back(progCmd.str());
  }
  std::string mf2Dir = "CMakeFiles/";
  mf2Dir += "Makefile2";
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir, recursiveTarget));
  this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                        this->GetCurrentBinaryDirectory());
  {
    std::ostringstream progCmd;
    progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
    progCmd << this->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(progressDir), cmOutputConverter::SHELL);
    progCmd << " 0";
    commands.push_back(progCmd.str());
  }
  this->WriteMakeRule(ruleFileStream, "The main all target", "all", depends,
                      commands, true);

  // Write the clean rule.
  recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/clean";
  commands.clear();
  depends.clear();
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir, recursiveTarget));
  this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                        this->GetCurrentBinaryDirectory());
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean",
                      depends, commands, true);
  commands.clear();
  depends.clear();
  depends.emplace_back("clean");
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean/fast",
                      depends, commands, true);

  // Write the preinstall rule.
  recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/preinstall";
  commands.clear();
  depends.clear();
  const char* noall =
    this->Makefile->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
  if (!noall || cmSystemTools::IsOff(noall)) {
    // Drive the build before installing.
    depends.emplace_back("all");
  } else if (regenerate) {
    // At least make sure the build system is up to date.
    depends.emplace_back("cmake_check_build_system");
  }
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir, recursiveTarget));
  this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                        this->GetCurrentBinaryDirectory());
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall", depends, commands, true);
  depends.clear();
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall/fast", depends, commands, true);

  if (regenerate) {
    // write the depend rule, really a recompute depends rule
    depends.clear();
    commands.clear();
    cmake* cm = this->GlobalGenerator->GetCMakeInstance();
    if (cm->DoWriteGlobVerifyTarget()) {
      std::string rescanRule = "$(CMAKE_COMMAND) -P ";
      rescanRule += this->ConvertToOutputFormat(cm->GetGlobVerifyScript(),
                                                cmOutputConverter::SHELL);
      commands.push_back(rescanRule);
    }
    std::string cmakefileName = "CMakeFiles/";
    cmakefileName += "Makefile.cmake";
    {
      std::string runRule =
        "$(CMAKE_COMMAND) -S$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)";
      runRule += " --check-build-system ";
      runRule +=
        this->ConvertToOutputFormat(cmakefileName, cmOutputConverter::SHELL);
      runRule += " 1";
      commands.push_back(std::move(runRule));
    }
    this->CreateCDCommand(commands, this->GetBinaryDirectory(),
                          this->GetCurrentBinaryDirectory());
    this->WriteMakeRule(ruleFileStream, "clear depends", "depend", depends,
                        commands, true);
  }
}